

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::PrimReserve(ImDrawList *this,int idx_count,int vtx_count)

{
  ImDrawCmd *pIVar1;
  int iVar2;
  ImDrawVert *__src;
  unsigned_short *__src_00;
  ImDrawVert *__dest;
  unsigned_short *__dest_00;
  int iVar3;
  int iVar4;
  
  pIVar1 = (this->CmdBuffer).Data + (long)(this->CmdBuffer).Size + -1;
  pIVar1->ElemCount = pIVar1->ElemCount + idx_count;
  iVar2 = (this->VtxBuffer).Size;
  iVar4 = vtx_count + iVar2;
  iVar3 = (this->VtxBuffer).Capacity;
  if (iVar3 < iVar4) {
    if (iVar3 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar3 / 2 + iVar3;
    }
    if (iVar3 <= iVar4) {
      iVar3 = iVar4;
    }
    __dest = (ImDrawVert *)ImGui::MemAlloc((long)iVar3 * 0x14);
    __src = (this->VtxBuffer).Data;
    if (__src != (ImDrawVert *)0x0) {
      memcpy(__dest,__src,(long)(this->VtxBuffer).Size * 0x14);
      ImGui::MemFree((this->VtxBuffer).Data);
    }
    (this->VtxBuffer).Data = __dest;
    (this->VtxBuffer).Capacity = iVar3;
  }
  else {
    __dest = (this->VtxBuffer).Data;
  }
  (this->VtxBuffer).Size = iVar4;
  this->_VtxWritePtr = __dest + iVar2;
  iVar2 = (this->IdxBuffer).Size;
  iVar4 = idx_count + iVar2;
  iVar3 = (this->IdxBuffer).Capacity;
  if (iVar3 < iVar4) {
    if (iVar3 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar3 / 2 + iVar3;
    }
    if (iVar3 <= iVar4) {
      iVar3 = iVar4;
    }
    __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar3 * 2);
    __src_00 = (this->IdxBuffer).Data;
    if (__src_00 != (unsigned_short *)0x0) {
      memcpy(__dest_00,__src_00,(long)(this->IdxBuffer).Size * 2);
      ImGui::MemFree((this->IdxBuffer).Data);
    }
    (this->IdxBuffer).Data = __dest_00;
    (this->IdxBuffer).Capacity = iVar3;
  }
  else {
    __dest_00 = (this->IdxBuffer).Data;
  }
  (this->IdxBuffer).Size = iVar4;
  this->_IdxWritePtr = __dest_00 + iVar2;
  return;
}

Assistant:

void ImDrawList::PrimReserve(int idx_count, int vtx_count)
{
    ImDrawCmd& draw_cmd = CmdBuffer.Data[CmdBuffer.Size-1];
    draw_cmd.ElemCount += idx_count;

    int vtx_buffer_old_size = VtxBuffer.Size;
    VtxBuffer.resize(vtx_buffer_old_size + vtx_count);
    _VtxWritePtr = VtxBuffer.Data + vtx_buffer_old_size;

    int idx_buffer_old_size = IdxBuffer.Size;
    IdxBuffer.resize(idx_buffer_old_size + idx_count);
    _IdxWritePtr = IdxBuffer.Data + idx_buffer_old_size;
}